

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall Catch::XmlReporter::XmlReporter(XmlReporter *this,ReporterConfig *_config)

{
  StreamingReporterBase::StreamingReporterBase(&this->super_StreamingReporterBase,_config);
  (this->super_StreamingReporterBase).super_SharedImpl<Catch::IStreamingReporter>.
  super_IStreamingReporter.super_IShared.super_NonCopyable._vptr_NonCopyable =
       (_func_int **)&PTR__XmlReporter_00188e90;
  (this->m_testCaseTimer).m_ticks = 0;
  (this->m_xml).m_tagIsOpen = false;
  (this->m_xml).m_needsNewline = false;
  (this->m_xml).m_tags.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_xml).m_tags.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_xml).m_tags.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_xml).m_indent._M_dataplus._M_p = (pointer)&(this->m_xml).m_indent.field_2;
  (this->m_xml).m_indent._M_string_length = 0;
  (this->m_xml).m_indent.field_2._M_local_buf[0] = '\0';
  (this->m_xml).m_os = (ostream *)&std::cout;
  this->m_sectionDepth = 0;
  (this->super_StreamingReporterBase).m_reporterPrefs.shouldRedirectStdOut = true;
  return;
}

Assistant:

XmlReporter( ReporterConfig const& _config )
        :   StreamingReporterBase( _config ),
            m_sectionDepth( 0 )
        {
            m_reporterPrefs.shouldRedirectStdOut = true;
        }